

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

TCGv_vec tcg_temp_new_vec_mipsel(TCGContext_conflict4 *tcg_ctx,TCGType_conflict type)

{
  TCGTemp *pTVar1;
  
  pTVar1 = tcg_temp_new_internal_mipsel(tcg_ctx,type,false);
  return (TCGv_vec)((long)pTVar1 - (long)tcg_ctx);
}

Assistant:

TCGv_vec tcg_temp_new_vec(TCGContext *tcg_ctx, TCGType type)
{
    TCGTemp *t;

#ifdef CONFIG_DEBUG_TCG
    switch (type) {
    case TCG_TYPE_V64:
        assert(TCG_TARGET_HAS_v64);
        break;
    case TCG_TYPE_V128:
        assert(TCG_TARGET_HAS_v128);
        break;
    case TCG_TYPE_V256:
        assert(TCG_TARGET_HAS_v256);
        break;
    default:
        g_assert_not_reached();
    }
#endif

    t = tcg_temp_new_internal(tcg_ctx, type, 0);
    return temp_tcgv_vec(tcg_ctx, t);
}